

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

int Mio_CheckGates(Mio_Library_t *pLib)

{
  int iVar1;
  Mio_Gate_t *pGate;
  Mio_Pin_t *pMVar2;
  Mio_Pin_t *pPin2;
  Mio_Pin_t *pPin1;
  
  pGate = Mio_LibraryReadGates(pLib);
  if (pGate != (Mio_Gate_t *)0x0) {
    pPin1 = (Mio_Pin_t *)0x0;
    do {
      pMVar2 = Mio_GateReadPins(pGate);
      while (pPin2 = pMVar2, pPin2 != (Mio_Pin_t *)0x0) {
        iVar1 = Mio_CheckPins(pPin1,pPin2);
        if (iVar1 == 0) {
          return 0;
        }
        pMVar2 = Mio_PinReadNext(pPin2);
        pPin1 = pPin2;
      }
      pGate = Mio_GateReadNext(pGate);
    } while (pGate != (Mio_Gate_t *)0x0);
  }
  return 1;
}

Assistant:

int Mio_CheckGates( Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;
    Mio_Pin_t * pPin0 = NULL, * pPin = NULL;
    Mio_LibraryForEachGate( pLib, pGate )
        Mio_GateForEachPin( pGate, pPin )
            if ( Mio_CheckPins( pPin0, pPin ) )
                pPin0 = pPin;
            else
                return 0;
    return 1;
}